

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

QDateTime __thiscall QDateTime::toOffsetFromUtc(QDateTime *this,int offsetSeconds)

{
  int in_EDX;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  Data local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.d = (QTimeZonePrivate *)0x0;
  if ((long)in_EDX + 0xe100U < 0x1c201) {
    local_18.d = (QTimeZonePrivate *)((3 - (ulong)(in_EDX == 0)) + (long)in_EDX * 4);
  }
  toTimeZone(this,(QTimeZone *)CONCAT44(in_register_00000034,offsetSeconds));
  QTimeZone::~QTimeZone((QTimeZone *)&local_18.s);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (QDateTime)(Data)this;
  }
  __stack_chk_fail();
}

Assistant:

QDateTime QDateTime::toOffsetFromUtc(int offsetSeconds) const
{
    return toTimeZone(QTimeZone::fromSecondsAheadOfUtc(offsetSeconds));
}